

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesImageSparseBinding.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::sparse::anon_unknown_4::ImageSparseBindingInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageSparseBindingInstance *this)

{
  UVec3 *imageSize;
  int *piVar1;
  TextureFormat *format;
  undefined8 *puVar2;
  DeviceDriver *vk;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImage buffer;
  VkImage VVar5;
  VkDeviceSize VVar6;
  undefined8 obj;
  undefined8 commandBuffer;
  undefined8 uVar7;
  void *pvVar8;
  undefined8 uVar9;
  bool bVar10;
  deUint32 dVar11;
  VkResult result;
  deUint32 dVar12;
  int iVar13;
  InstanceInterface *instance;
  VkPhysicalDevice physicalDevice;
  Queue *pQVar14;
  Queue *pQVar15;
  deUint64 *pdVar16;
  NotSupportedError *pNVar17;
  ulong uVar18;
  undefined4 extraout_var;
  ulong uVar19;
  long lVar20;
  long lVar21;
  VkExtent3D VVar22;
  VkExtent3D extent;
  VkDeviceSize in_stack_fffffffffffff9f8;
  VkSparseImageOpaqueMemoryBindInfo opaqueBindInfo;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> bufferImageCopy;
  undefined1 local_550 [36];
  deUint32 local_52c;
  deUint32 local_528;
  deUint32 local_524;
  undefined8 local_520;
  undefined8 local_518;
  deUint32 local_510;
  deUint32 *local_508;
  VkImageLayout local_500;
  Handle<(vk::HandleType)7> local_4f8;
  Deleter<vk::Handle<(vk::HandleType)7>_> DStack_4f0;
  VkImage local_4d8;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_4d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> referenceData;
  VkImageSubresourceRange res_2;
  VkImageSubresourceRange res_1;
  VkBufferCreateInfo inputBufferCreateInfo;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_420;
  VkBuffer local_408;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_400;
  TestStatus *local_3e8;
  VkPipelineStageFlags stageBits [1];
  VkSemaphore local_3d8;
  Deleter<vk::Handle<(vk::HandleType)4>_> DStack_3d0;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  deviceMemUniquePtrVec;
  VkMemoryRequirements imageSparseMemRequirements;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_380;
  VkBufferCreateInfo outputBufferCreateInfo;
  VkBool32 local_2b8;
  ulong local_208;
  
  instance = Context::getInstanceInterface
                       ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imageSize = &this->m_imageSize;
  bVar10 = isImageSizeSupported(instance,physicalDevice,this->m_imageType,imageSize);
  if (bVar10) {
    ::vk::getPhysicalDeviceFeatures
              ((VkPhysicalDeviceFeatures *)&outputBufferCreateInfo,instance,physicalDevice);
    if (local_2b8 != 0) {
      outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      outputBufferCreateInfo._4_4_ = 0;
      outputBufferCreateInfo.pNext = (void *)0x0;
      outputBufferCreateInfo.flags = 0;
      outputBufferCreateInfo._20_4_ = 0;
      inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
      inputBufferCreateInfo._4_4_ = 1;
      std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
      emplace_back<vkt::sparse::QueueRequirements>
                ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                  *)&outputBufferCreateInfo,(QueueRequirements *)&inputBufferCreateInfo);
      inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
      inputBufferCreateInfo._4_4_ = 1;
      std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
      emplace_back<vkt::sparse::QueueRequirements>
                ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                  *)&outputBufferCreateInfo,(QueueRequirements *)&inputBufferCreateInfo);
      SparseResourcesBaseInstance::createDeviceSupportingQueues
                (&this->super_SparseResourcesBaseInstance,
                 (QueueRequirementsVec *)&outputBufferCreateInfo);
      if (outputBufferCreateInfo._0_8_ != 0) {
        operator_delete((void *)outputBufferCreateInfo._0_8_,
                        outputBufferCreateInfo._16_8_ - outputBufferCreateInfo._0_8_);
      }
      vk = (this->super_SparseResourcesBaseInstance).m_deviceDriver.
           super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
      pQVar14 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,8,0);
      pQVar15 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,2,0);
      local_550._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
      local_550._8_8_ = (void *)0x0;
      local_550._16_4_ = 1;
      local_550._20_4_ = mapImageType(this->m_imageType);
      format = &this->m_format;
      local_550._24_4_ = ::vk::mapTextureFormat(format);
      getLayerSize((sparse *)&outputBufferCreateInfo,this->m_imageType,imageSize);
      local_550._28_8_ = outputBufferCreateInfo._0_8_;
      local_52c = (deUint32)outputBufferCreateInfo.pNext;
      local_524 = getNumLayers(this->m_imageType,imageSize);
      local_520._0_4_ = VK_SAMPLE_COUNT_1_BIT;
      local_520._4_4_ = VK_IMAGE_TILING_OPTIMAL;
      local_500 = VK_IMAGE_LAYOUT_UNDEFINED;
      local_518._0_4_ = 3;
      local_518._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
      local_510 = 0;
      local_508 = (deUint32 *)0x0;
      if (this->m_imageType - IMAGE_TYPE_CUBE < 2) {
        local_550._16_4_ = local_550._16_4_ | 0x10;
      }
      (*instance->_vptr_InstanceInterface[4])
                (instance,physicalDevice,(ulong)(uint)local_550._24_4_,(ulong)(uint)local_550._20_4_
                 ,0,3,local_550._16_4_,&outputBufferCreateInfo);
      local_528 = getImageMaxMipLevels
                            ((VkImageFormatProperties *)&outputBufferCreateInfo,
                             (VkExtent3D *)(local_550 + 0x1c));
      ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&outputBufferCreateInfo,
                        &vk->super_DeviceInterface,
                        (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                        super_RefBase<vk::VkDevice_s_*>.m_data.object,(VkImageCreateInfo *)local_550
                        ,(VkAllocationCallbacks *)0x0);
      DStack_4d0.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
      DStack_4d0.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
      local_4d8.m_internal = outputBufferCreateInfo._0_8_;
      DStack_4d0.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
      ::vk::createSemaphore
                ((Move<vk::Handle<(vk::HandleType)4>_> *)&outputBufferCreateInfo,
                 &vk->super_DeviceInterface,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,0,(VkAllocationCallbacks *)0x0);
      DStack_3d0.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
      DStack_3d0.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
      local_3d8.m_internal = outputBufferCreateInfo._0_8_;
      DStack_3d0.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
      ::vk::getImageMemoryRequirements
                (&imageSparseMemRequirements,&vk->super_DeviceInterface,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,local_4d8);
      VVar6 = imageSparseMemRequirements.size;
      ::vk::getPhysicalDeviceProperties
                ((VkPhysicalDeviceProperties *)&outputBufferCreateInfo,instance,physicalDevice);
      if (local_208 < VVar6) {
        pNVar17 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar17,"Required memory size for sparse resource exceeds device limits",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseBinding.cpp"
                   ,0xba);
        __cxa_throw(pNVar17,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      inputBufferCreateInfo._4_4_ = 0;
      inputBufferCreateInfo.pNext = (void *)0x0;
      inputBufferCreateInfo.flags = 0;
      inputBufferCreateInfo._20_4_ = 0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = imageSparseMemRequirements.alignment;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = imageSparseMemRequirements.size;
      dVar11 = findMatchingMemoryType
                         (instance,physicalDevice,&imageSparseMemRequirements,
                          (MemoryRequirement *)&::vk::MemoryRequirement::Any);
      if (dVar11 == 0xffffffff) {
        outputBufferCreateInfo._0_8_ = &outputBufferCreateInfo.flags;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&outputBufferCreateInfo,"No matching memory type found","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,outputBufferCreateInfo._0_8_,
                   (long)outputBufferCreateInfo.pNext + outputBufferCreateInfo._0_8_);
        if ((VkBufferCreateFlags *)outputBufferCreateInfo._0_8_ != &outputBufferCreateInfo.flags) {
          operator_delete((void *)outputBufferCreateInfo._0_8_,outputBufferCreateInfo._16_8_ + 1);
        }
      }
      else {
        dVar12 = SUB164(auVar4 / auVar3,0);
        local_3e8 = __return_storage_ptr__;
        if (dVar12 != 0) {
          uVar19 = 0;
          do {
            makeSparseMemoryBind
                      ((VkSparseMemoryBind *)&outputBufferCreateInfo,&vk->super_DeviceInterface,
                       (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                       super_RefBase<vk::VkDevice_s_*>.m_data.object,
                       imageSparseMemRequirements.alignment,dVar11,
                       imageSparseMemRequirements.alignment * uVar19);
            local_4f8.m_internal =
                 (deUint64)
                 ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                           ((Handle<(vk::HandleType)7>)outputBufferCreateInfo._16_8_);
            DStack_4f0.m_device =
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object;
            DStack_4f0.m_allocator = (VkAllocationCallbacks *)0x0;
            DStack_4f0.m_deviceIface = &vk->super_DeviceInterface;
            pdVar16 = (deUint64 *)operator_new(0x20);
            pdVar16[2] = (deUint64)DStack_4f0.m_device;
            pdVar16[3] = (deUint64)DStack_4f0.m_allocator;
            *pdVar16 = local_4f8.m_internal;
            pdVar16[1] = (deUint64)DStack_4f0.m_deviceIface;
            local_4f8.m_internal = 0;
            DStack_4f0.m_deviceIface = (DeviceInterface *)0x0;
            DStack_4f0.m_device = (VkDevice)0x0;
            DStack_4f0.m_allocator = (VkAllocationCallbacks *)0x0;
            opaqueBindInfo.bindCount = 0;
            opaqueBindInfo._12_4_ = 0;
            opaqueBindInfo.image.m_internal = (deUint64)pdVar16;
            opaqueBindInfo._8_8_ = operator_new(0x20);
            *(undefined4 *)(opaqueBindInfo._8_8_ + 8) = 0;
            *(undefined4 *)(opaqueBindInfo._8_8_ + 0xc) = 0;
            *(undefined ***)opaqueBindInfo._8_8_ = &PTR__SharedPtrState_00d1dd90;
            *(deUint64 **)(opaqueBindInfo._8_8_ + 0x10) = pdVar16;
            *(undefined4 *)(opaqueBindInfo._8_8_ + 8) = 1;
            *(undefined4 *)(opaqueBindInfo._8_8_ + 0xc) = 1;
            std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
            ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>
                      ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                        *)&deviceMemUniquePtrVec,
                       (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                       &opaqueBindInfo);
            if (opaqueBindInfo._8_8_ != 0) {
              LOCK();
              piVar1 = (int *)(opaqueBindInfo._8_8_ + 8);
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                opaqueBindInfo.image.m_internal = 0;
                (**(code **)(*(long *)opaqueBindInfo._8_8_ + 0x10))();
              }
              LOCK();
              piVar1 = (int *)(opaqueBindInfo._8_8_ + 0xc);
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (opaqueBindInfo._8_8_ != 0) {
                  (**(code **)(*(long *)opaqueBindInfo._8_8_ + 8))();
                }
                opaqueBindInfo.bindCount = 0;
                opaqueBindInfo._12_4_ = 0;
              }
            }
            if (local_4f8.m_internal != 0) {
              ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                        (&DStack_4f0,(VkDeviceMemory)local_4f8.m_internal);
            }
            DStack_4f0.m_device = (VkDevice)0x0;
            DStack_4f0.m_allocator = (VkAllocationCallbacks *)0x0;
            local_4f8.m_internal = 0;
            DStack_4f0.m_deviceIface = (DeviceInterface *)0x0;
            if (inputBufferCreateInfo.pNext == (void *)inputBufferCreateInfo._16_8_) {
              std::vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>>::
              _M_realloc_insert<vk::VkSparseMemoryBind_const&>
                        ((vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>> *)
                         &inputBufferCreateInfo,(iterator)inputBufferCreateInfo.pNext,
                         (VkSparseMemoryBind *)&outputBufferCreateInfo);
            }
            else {
              *(ulong *)((long)inputBufferCreateInfo.pNext + 0x20) =
                   CONCAT44(outputBufferCreateInfo.sharingMode,outputBufferCreateInfo.usage);
              *(undefined8 *)((long)inputBufferCreateInfo.pNext + 0x10) =
                   outputBufferCreateInfo._16_8_;
              *(VkDeviceSize *)((long)inputBufferCreateInfo.pNext + 0x18) =
                   outputBufferCreateInfo.size;
              *(undefined8 *)inputBufferCreateInfo.pNext = outputBufferCreateInfo._0_8_;
              *(void **)((long)inputBufferCreateInfo.pNext + 8) = outputBufferCreateInfo.pNext;
              inputBufferCreateInfo.pNext = (void *)((long)inputBufferCreateInfo.pNext + 0x28);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 < (SUB168(auVar4 / auVar3,0) & 0xffffffff));
        }
        opaqueBindInfo.image.m_internal = local_4d8.m_internal;
        opaqueBindInfo.bindCount = dVar12;
        opaqueBindInfo.pBinds = (VkSparseMemoryBind *)inputBufferCreateInfo._0_8_;
        outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
        outputBufferCreateInfo.pNext = (void *)0x0;
        outputBufferCreateInfo._16_8_ = outputBufferCreateInfo._16_8_ & 0xffffffff00000000;
        outputBufferCreateInfo.size = 0;
        outputBufferCreateInfo.usage = 0;
        outputBufferCreateInfo.queueFamilyIndexCount = 0;
        outputBufferCreateInfo._44_4_ = 0;
        outputBufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
        result = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x11])
                           (vk,pQVar14->queueHandle,1);
        ::vk::checkResult(result,
                          "deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseBinding.cpp"
                          ,0xe3);
        __return_storage_ptr__ = local_3e8;
      }
      if (inputBufferCreateInfo._0_8_ != 0) {
        operator_delete((void *)inputBufferCreateInfo._0_8_,
                        inputBufferCreateInfo._16_8_ - inputBufferCreateInfo._0_8_);
      }
      if (dVar11 != 0xffffffff) {
        makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&outputBufferCreateInfo,
                        &vk->super_DeviceInterface,
                        (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                        super_RefBase<vk::VkDevice_s_*>.m_data.object,pQVar15->queueFamilyIndex);
        obj = outputBufferCreateInfo._0_8_;
        DStack_380.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
        DStack_380.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
        DStack_380.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
        ::vk::allocateCommandBuffer
                  ((Move<vk::VkCommandBuffer_s_*> *)&outputBufferCreateInfo,
                   &vk->super_DeviceInterface,
                   (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (VkCommandPool)outputBufferCreateInfo._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
        VVar6 = outputBufferCreateInfo.size;
        uVar9 = outputBufferCreateInfo._16_8_;
        pvVar8 = outputBufferCreateInfo.pNext;
        commandBuffer = outputBufferCreateInfo._0_8_;
        std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::vector
                  (&bufferImageCopy,(ulong)local_528,(allocator_type *)&outputBufferCreateInfo);
        if (local_528 != 0) {
          lVar20 = 0;
          uVar19 = 0;
          dVar11 = 0;
          do {
            dVar12 = (deUint32)uVar19;
            VVar22 = mipLevelExtents((VkExtent3D *)(local_550 + 0x1c),dVar12);
            extent.width = VVar22.depth;
            extent.height = extraout_var;
            extent.depth = local_524;
            makeBufferImageCopy((VkBufferImageCopy *)&outputBufferCreateInfo,VVar22._0_8_,extent,
                                dVar12,dVar11,in_stack_fffffffffffff9f8);
            *(ulong *)((long)&((bufferImageCopy.
                                super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                ._M_impl.super__Vector_impl_data._M_start)->imageExtent).height +
                      lVar20) =
                 CONCAT44(outputBufferCreateInfo.pQueueFamilyIndices._4_4_,
                          outputBufferCreateInfo.pQueueFamilyIndices._0_4_);
            puVar2 = (undefined8 *)
                     ((long)&((bufferImageCopy.
                               super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                               ._M_impl.super__Vector_impl_data._M_start)->imageOffset).x + lVar20);
            *puVar2 = CONCAT44(outputBufferCreateInfo.sharingMode,outputBufferCreateInfo.usage);
            puVar2[1] = outputBufferCreateInfo._40_8_;
            puVar2 = (undefined8 *)
                     ((long)&((bufferImageCopy.
                               super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                               ._M_impl.super__Vector_impl_data._M_start)->imageSubresource).
                             aspectMask + lVar20);
            *puVar2 = outputBufferCreateInfo._16_8_;
            puVar2[1] = outputBufferCreateInfo.size;
            puVar2 = (undefined8 *)
                     ((long)&(bufferImageCopy.
                              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                              ._M_impl.super__Vector_impl_data._M_start)->bufferOffset + lVar20);
            *puVar2 = outputBufferCreateInfo._0_8_;
            puVar2[1] = outputBufferCreateInfo.pNext;
            dVar12 = getImageMipLevelSizeInBytes
                               ((VkExtent3D *)(local_550 + 0x1c),local_524,format,dVar12,4);
            dVar11 = dVar11 + dVar12;
            uVar19 = uVar19 + 1;
            lVar20 = lVar20 + 0x38;
          } while (uVar19 < local_528);
        }
        beginCommandBuffer(&vk->super_DeviceInterface,(VkCommandBuffer)commandBuffer);
        dVar11 = getImageSizeInBytes((VkExtent3D *)(local_550 + 0x1c),local_524,format,local_528,4);
        uVar19 = (ulong)dVar11;
        makeBufferCreateInfo(&inputBufferCreateInfo,uVar19,1);
        ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&outputBufferCreateInfo,
                           &vk->super_DeviceInterface,
                           (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                           super_RefBase<vk::VkDevice_s_*>.m_data.object,&inputBufferCreateInfo,
                           (VkAllocationCallbacks *)0x0);
        DStack_400.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
        DStack_400.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
        local_408.m_internal = outputBufferCreateInfo._0_8_;
        DStack_400.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
        bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                   &outputBufferCreateInfo,&vk->super_DeviceInterface,
                   (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (this->super_SparseResourcesBaseInstance).m_allocator.
                   super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
                   (VkBuffer)outputBufferCreateInfo._0_8_,(MemoryRequirement)0x1);
        uVar7 = outputBufferCreateInfo._0_8_;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&referenceData,uVar19,(allocator_type *)&outputBufferCreateInfo);
        if (dVar11 != 0) {
          uVar18 = 0;
          do {
            referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18] =
                 (char)(uVar18 % imageSparseMemRequirements.alignment) + '\x01';
            uVar18 = uVar18 + 1;
          } while (uVar19 != uVar18);
        }
        memcpy(*(void **)(uVar7 + 0x18),
               referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,uVar19);
        ::vk::flushMappedMemoryRange
                  (&vk->super_DeviceInterface,
                   (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (VkDeviceMemory)*(deUint64 *)(uVar7 + 8),*(VkDeviceSize *)(uVar7 + 0x10),uVar19);
        makeBufferMemoryBarrier
                  ((VkBufferMemoryBarrier *)&outputBufferCreateInfo,0x4000,0x800,local_408,0,uVar19)
        ;
        (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                  (vk,commandBuffer,0x4000,0x1000,0,0,0,1,
                   (VkBufferMemoryBarrier *)&outputBufferCreateInfo,0,0);
        dVar11 = pQVar15->queueFamilyIndex;
        dVar12 = pQVar14->queueFamilyIndex;
        if (pQVar14->queueFamilyIndex == pQVar15->queueFamilyIndex) {
          dVar11 = 0xffffffff;
          dVar12 = 0xffffffff;
        }
        subresourceRange.levelCount = local_528;
        subresourceRange.aspectMask = 1;
        subresourceRange.baseMipLevel = 0;
        subresourceRange.baseArrayLayer = 0;
        subresourceRange.layerCount = local_524;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&outputBufferCreateInfo,0,0x1000,
                   VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,dVar12,dVar11,
                   local_4d8,subresourceRange);
        (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                  (vk,commandBuffer,1,0x1000,0,0,0,0,0,1,
                   (int)(VkImageMemoryBarrier *)&outputBufferCreateInfo);
        (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x62])
                  (vk,commandBuffer,local_408.m_internal,local_4d8.m_internal,7,
                   (ulong)(uint)((int)((ulong)((long)bufferImageCopy.
                                                                                                          
                                                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)bufferImageCopy.
                                                                                                        
                                                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                -0x49249249),
                   (int)bufferImageCopy.
                        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        subresourceRange_00.levelCount = local_528;
        subresourceRange_00.aspectMask = 1;
        subresourceRange_00.baseMipLevel = 0;
        subresourceRange_00.baseArrayLayer = 0;
        subresourceRange_00.layerCount = local_524;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&outputBufferCreateInfo,0x1000,0x800,
                   VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                   local_4d8,subresourceRange_00);
        (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                  (vk,commandBuffer,0x1000,0x1000,0,0,0,0,0,1,
                   (int)(VkImageMemoryBarrier *)&outputBufferCreateInfo);
        makeBufferCreateInfo(&outputBufferCreateInfo,uVar19,2);
        ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&opaqueBindInfo,
                           &vk->super_DeviceInterface,
                           (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                           super_RefBase<vk::VkDevice_s_*>.m_data.object,&outputBufferCreateInfo,
                           (VkAllocationCallbacks *)0x0);
        buffer = opaqueBindInfo.image;
        DStack_420.m_device = (VkDevice)opaqueBindInfo.pBinds;
        DStack_420.m_deviceIface = (DeviceInterface *)opaqueBindInfo._8_8_;
        bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&opaqueBindInfo,
                   &vk->super_DeviceInterface,
                   (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (this->super_SparseResourcesBaseInstance).m_allocator.
                   super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
                   (VkBuffer)opaqueBindInfo.image.m_internal,(MemoryRequirement)0x1);
        VVar5 = opaqueBindInfo.image;
        (*(vk->super_DeviceInterface)._vptr_DeviceInterface[99])
                  (vk,commandBuffer,local_4d8.m_internal,6,buffer.m_internal,
                   (ulong)(uint)((int)((ulong)((long)bufferImageCopy.
                                                                                                          
                                                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)bufferImageCopy.
                                                                                                        
                                                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                -0x49249249),
                   (int)bufferImageCopy.
                        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        makeBufferMemoryBarrier
                  ((VkBufferMemoryBarrier *)&opaqueBindInfo,0x1000,0x2000,
                   (VkBuffer)buffer.m_internal,0,uVar19);
        (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                  (vk,commandBuffer,0x1000,0x4000,0,0,0,1,(VkBufferMemoryBarrier *)&opaqueBindInfo,0
                   ,0);
        endCommandBuffer(&vk->super_DeviceInterface,(VkCommandBuffer)commandBuffer);
        stageBits[0] = 0x1000;
        submitCommandsAndWait
                  (&vk->super_DeviceInterface,
                   (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,pQVar15->queueHandle,
                   (VkCommandBuffer)commandBuffer,1,&local_3d8,stageBits,0,(VkSemaphore *)0x0);
        ::vk::invalidateMappedMemoryRange
                  (&vk->super_DeviceInterface,
                   (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (VkDeviceMemory)*(deUint64 *)(VVar5.m_internal + 8),
                   *(VkDeviceSize *)(VVar5.m_internal + 0x10),uVar19);
        lVar20 = *(long *)(VVar5.m_internal + 0x18);
        (*(vk->super_DeviceInterface)._vptr_DeviceInterface[3])(vk,pQVar14->queueHandle);
        if (local_528 != 0) {
          lVar21 = 0;
          uVar19 = 0;
          do {
            dVar11 = getImageMipLevelSizeInBytes
                               ((VkExtent3D *)(local_550 + 0x1c),local_524,format,(deUint32)uVar19,1
                               );
            uVar18 = (ulong)*(uint *)((long)&(bufferImageCopy.
                                              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                             bufferOffset + lVar21);
            iVar13 = bcmp((void *)(lVar20 + uVar18),
                          referenceData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar18,(ulong)dVar11);
            if (iVar13 != 0) {
              opaqueBindInfo.image.m_internal = (deUint64)&opaqueBindInfo.pBinds;
              std::__cxx11::string::_M_construct<char_const*>((string *)&opaqueBindInfo,"Failed","")
              ;
              __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
              (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->m_description).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__return_storage_ptr__->m_description,
                         opaqueBindInfo.image.m_internal,
                         opaqueBindInfo._8_8_ + opaqueBindInfo.image.m_internal);
              goto LAB_007509f2;
            }
            uVar19 = uVar19 + 1;
            lVar21 = lVar21 + 0x38;
          } while (uVar19 < local_528);
        }
        opaqueBindInfo.image.m_internal = (deUint64)&opaqueBindInfo.pBinds;
        std::__cxx11::string::_M_construct<char_const*>((string *)&opaqueBindInfo,"Passed","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,opaqueBindInfo.image.m_internal,
                   opaqueBindInfo._8_8_ + opaqueBindInfo.image.m_internal);
LAB_007509f2:
        if ((VkSparseMemoryBind **)opaqueBindInfo.image.m_internal != &opaqueBindInfo.pBinds) {
          operator_delete((void *)opaqueBindInfo.image.m_internal,
                          (ulong)((long)&(opaqueBindInfo.pBinds)->resourceOffset + 1));
        }
        if (VVar5.m_internal != 0) {
          (**(code **)(*(long *)VVar5.m_internal + 8))(VVar5.m_internal);
        }
        if (buffer.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                    (&DStack_420,(VkBuffer)buffer.m_internal);
        }
        if (referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(referenceData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)referenceData.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)referenceData.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (uVar7 != 0) {
          (**(code **)(*(long *)uVar7 + 8))(uVar7);
        }
        if (local_408.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                    (&DStack_400,local_408);
        }
        if (bufferImageCopy.
            super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(bufferImageCopy.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)bufferImageCopy.
                                super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)bufferImageCopy.
                                super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (commandBuffer != 0) {
          outputBufferCreateInfo._0_8_ = commandBuffer;
          (**(code **)(*pvVar8 + 0x240))(pvVar8,uVar9,VVar6,1);
        }
        if (obj != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                    (&DStack_380,(VkCommandPool)obj);
        }
      }
      if (local_3d8.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()(&DStack_3d0,local_3d8)
        ;
      }
      if (local_4d8.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_4d0,local_4d8)
        ;
      }
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
      ::~vector(&deviceMemUniquePtrVec);
      return __return_storage_ptr__;
    }
    pNVar17 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar17,"Device does not support sparse binding",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseBinding.cpp"
               ,0x7e);
  }
  else {
    pNVar17 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar17,"Image size not supported for device",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseBinding.cpp"
               ,0x7a);
  }
  __cxa_throw(pNVar17,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus ImageSparseBindingInstance::iterate (void)
{
	const InstanceInterface&	instance		= m_context.getInstanceInterface();
	const VkPhysicalDevice		physicalDevice	= m_context.getPhysicalDevice();
	VkImageCreateInfo			imageSparseInfo;
	std::vector<DeviceMemorySp>	deviceMemUniquePtrVec;

	// Check if image size does not exceed device limits
	if (!isImageSizeSupported(instance, physicalDevice, m_imageType, m_imageSize))
		TCU_THROW(NotSupportedError, "Image size not supported for device");

	// Check if device supports sparse binding
	if (!getPhysicalDeviceFeatures(instance, physicalDevice).sparseBinding)
		TCU_THROW(NotSupportedError, "Device does not support sparse binding");

	{
		// Create logical device supporting both sparse and compute queues
		QueueRequirementsVec queueRequirements;
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_COMPUTE_BIT, 1u));

		createDeviceSupportingQueues(queueRequirements);
	}

	const DeviceInterface&	deviceInterface	= getDeviceInterface();
	const Queue&			sparseQueue		= getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0);
	const Queue&			computeQueue	= getQueue(VK_QUEUE_COMPUTE_BIT, 0);

	imageSparseInfo.sType					= VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;					//VkStructureType		sType;
	imageSparseInfo.pNext					= DE_NULL;												//const void*			pNext;
	imageSparseInfo.flags					= VK_IMAGE_CREATE_SPARSE_BINDING_BIT;					//VkImageCreateFlags	flags;
	imageSparseInfo.imageType				= mapImageType(m_imageType);							//VkImageType			imageType;
	imageSparseInfo.format					= mapTextureFormat(m_format);							//VkFormat				format;
	imageSparseInfo.extent					= makeExtent3D(getLayerSize(m_imageType, m_imageSize));	//VkExtent3D			extent;
	imageSparseInfo.arrayLayers				= getNumLayers(m_imageType, m_imageSize);				//deUint32				arrayLayers;
	imageSparseInfo.samples					= VK_SAMPLE_COUNT_1_BIT;								//VkSampleCountFlagBits	samples;
	imageSparseInfo.tiling					= VK_IMAGE_TILING_OPTIMAL;								//VkImageTiling			tiling;
	imageSparseInfo.initialLayout			= VK_IMAGE_LAYOUT_UNDEFINED;							//VkImageLayout			initialLayout;
	imageSparseInfo.usage					= VK_IMAGE_USAGE_TRANSFER_SRC_BIT |
											  VK_IMAGE_USAGE_TRANSFER_DST_BIT;						//VkImageUsageFlags		usage;
	imageSparseInfo.sharingMode				= VK_SHARING_MODE_EXCLUSIVE;							//VkSharingMode			sharingMode;
	imageSparseInfo.queueFamilyIndexCount	= 0u;													//deUint32				queueFamilyIndexCount;
	imageSparseInfo.pQueueFamilyIndices		= DE_NULL;												//const deUint32*		pQueueFamilyIndices;

	if (m_imageType == IMAGE_TYPE_CUBE || m_imageType == IMAGE_TYPE_CUBE_ARRAY)
	{
		imageSparseInfo.flags |= VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;
	}

	{
		VkImageFormatProperties imageFormatProperties;
		instance.getPhysicalDeviceImageFormatProperties(physicalDevice,
			imageSparseInfo.format,
			imageSparseInfo.imageType,
			imageSparseInfo.tiling,
			imageSparseInfo.usage,
			imageSparseInfo.flags,
			&imageFormatProperties);

		imageSparseInfo.mipLevels = getImageMaxMipLevels(imageFormatProperties, imageSparseInfo.extent);
	}

	// Create sparse image
	const Unique<VkImage> imageSparse(createImage(deviceInterface, getDevice(), &imageSparseInfo));

	// Create sparse image memory bind semaphore
	const Unique<VkSemaphore> imageMemoryBindSemaphore(createSemaphore(deviceInterface, getDevice()));

	// Get sparse image general memory requirements
	const VkMemoryRequirements imageSparseMemRequirements = getImageMemoryRequirements(deviceInterface, getDevice(), *imageSparse);

	// Check if required image memory size does not exceed device limits
	if (imageSparseMemRequirements.size > getPhysicalDeviceProperties(instance, physicalDevice).limits.sparseAddressSpaceSize)
		TCU_THROW(NotSupportedError, "Required memory size for sparse resource exceeds device limits");

	DE_ASSERT((imageSparseMemRequirements.size % imageSparseMemRequirements.alignment) == 0);

	{
		std::vector<VkSparseMemoryBind>	sparseMemoryBinds;
		const deUint32					numSparseBinds	= static_cast<deUint32>(imageSparseMemRequirements.size / imageSparseMemRequirements.alignment);
		const deUint32					memoryType		= findMatchingMemoryType(instance, physicalDevice, imageSparseMemRequirements, MemoryRequirement::Any);

		if (memoryType == NO_MATCH_FOUND)
			return tcu::TestStatus::fail("No matching memory type found");

		for (deUint32 sparseBindNdx = 0; sparseBindNdx < numSparseBinds; ++sparseBindNdx)
		{
			const VkSparseMemoryBind sparseMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(),
				imageSparseMemRequirements.alignment, memoryType, imageSparseMemRequirements.alignment * sparseBindNdx);

			deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(sparseMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

			sparseMemoryBinds.push_back(sparseMemoryBind);
		}

		const VkSparseImageOpaqueMemoryBindInfo opaqueBindInfo = makeSparseImageOpaqueMemoryBindInfo(*imageSparse, numSparseBinds, &sparseMemoryBinds[0]);

		const VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			0u,											//deUint32									bufferBindCount;
			DE_NULL,									//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			1u,											//deUint32									imageOpaqueBindCount;
			&opaqueBindInfo,							//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&imageMemoryBindSemaphore.get()				//const VkSemaphore*						pSignalSemaphores;
		};

		// Submit sparse bind commands for execution
		VK_CHECK(deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL));
	}

	// Create command buffer for compute and transfer oparations
	const Unique<VkCommandPool>	  commandPool(makeCommandPool(deviceInterface, getDevice(), computeQueue.queueFamilyIndex));
	const Unique<VkCommandBuffer> commandBuffer(allocateCommandBuffer(deviceInterface, getDevice(), *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	std::vector<VkBufferImageCopy> bufferImageCopy(imageSparseInfo.mipLevels);

	{
		deUint32 bufferOffset = 0;
		for (deUint32 mipmapNdx = 0; mipmapNdx < imageSparseInfo.mipLevels; mipmapNdx++)
		{
			bufferImageCopy[mipmapNdx] = makeBufferImageCopy(mipLevelExtents(imageSparseInfo.extent, mipmapNdx), imageSparseInfo.arrayLayers, mipmapNdx, static_cast<VkDeviceSize>(bufferOffset));
			bufferOffset += getImageMipLevelSizeInBytes(imageSparseInfo.extent, imageSparseInfo.arrayLayers, m_format, mipmapNdx, BUFFER_IMAGE_COPY_OFFSET_GRANULARITY);
		}
	}

	// Start recording commands
	beginCommandBuffer(deviceInterface, *commandBuffer);

	const deUint32					imageSizeInBytes		= getImageSizeInBytes(imageSparseInfo.extent, imageSparseInfo.arrayLayers, m_format, imageSparseInfo.mipLevels, BUFFER_IMAGE_COPY_OFFSET_GRANULARITY);
	const VkBufferCreateInfo		inputBufferCreateInfo	= makeBufferCreateInfo(imageSizeInBytes, VK_BUFFER_USAGE_TRANSFER_SRC_BIT);
	const Unique<VkBuffer>			inputBuffer				(createBuffer(deviceInterface, getDevice(), &inputBufferCreateInfo));
	const de::UniquePtr<Allocation>	inputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *inputBuffer, MemoryRequirement::HostVisible));

	std::vector<deUint8> referenceData(imageSizeInBytes);

	for (deUint32 valueNdx = 0; valueNdx < imageSizeInBytes; ++valueNdx)
	{
		referenceData[valueNdx] = static_cast<deUint8>((valueNdx % imageSparseMemRequirements.alignment) + 1u);
	}

	deMemcpy(inputBufferAlloc->getHostPtr(), &referenceData[0], imageSizeInBytes);

	flushMappedMemoryRange(deviceInterface, getDevice(), inputBufferAlloc->getMemory(), inputBufferAlloc->getOffset(), imageSizeInBytes);

	{
		const VkBufferMemoryBarrier inputBufferBarrier = makeBufferMemoryBarrier
		(
			VK_ACCESS_HOST_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			*inputBuffer,
			0u,
			imageSizeInBytes
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 1u, &inputBufferBarrier, 0u, DE_NULL);
	}

	{
		const VkImageMemoryBarrier imageSparseTransferDstBarrier = makeImageMemoryBarrier
		(
			0u,
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED,
			VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex ? sparseQueue.queueFamilyIndex : VK_QUEUE_FAMILY_IGNORED,
			sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex ? computeQueue.queueFamilyIndex : VK_QUEUE_FAMILY_IGNORED,
			*imageSparse,
			makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, imageSparseInfo.mipLevels, 0u, imageSparseInfo.arrayLayers)
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &imageSparseTransferDstBarrier);
	}

	deviceInterface.cmdCopyBufferToImage(*commandBuffer, *inputBuffer, *imageSparse, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, static_cast<deUint32>(bufferImageCopy.size()), &bufferImageCopy[0]);

	{
		const VkImageMemoryBarrier imageSparseTransferSrcBarrier = makeImageMemoryBarrier
		(
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*imageSparse,
			makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, imageSparseInfo.mipLevels, 0u, imageSparseInfo.arrayLayers)
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &imageSparseTransferSrcBarrier);
	}

	const VkBufferCreateInfo		outputBufferCreateInfo	= makeBufferCreateInfo(imageSizeInBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	const Unique<VkBuffer>			outputBuffer			(createBuffer(deviceInterface, getDevice(), &outputBufferCreateInfo));
	const de::UniquePtr<Allocation>	outputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *outputBuffer, MemoryRequirement::HostVisible));

	deviceInterface.cmdCopyImageToBuffer(*commandBuffer, *imageSparse, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *outputBuffer, static_cast<deUint32>(bufferImageCopy.size()), &bufferImageCopy[0]);

	{
		const VkBufferMemoryBarrier outputBufferBarrier = makeBufferMemoryBarrier
		(
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_ACCESS_HOST_READ_BIT,
			*outputBuffer,
			0u,
			imageSizeInBytes
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u, 0u, DE_NULL, 1u, &outputBufferBarrier, 0u, DE_NULL);
	}

	// End recording commands
	endCommandBuffer(deviceInterface, *commandBuffer);

	const VkPipelineStageFlags stageBits[] = { VK_PIPELINE_STAGE_TRANSFER_BIT };

	// Submit commands for execution and wait for completion
	submitCommandsAndWait(deviceInterface, getDevice(), computeQueue.queueHandle, *commandBuffer, 1u, &imageMemoryBindSemaphore.get(), stageBits);

	// Retrieve data from buffer to host memory
	invalidateMappedMemoryRange(deviceInterface, getDevice(), outputBufferAlloc->getMemory(), outputBufferAlloc->getOffset(), imageSizeInBytes);

	const deUint8* outputData = static_cast<const deUint8*>(outputBufferAlloc->getHostPtr());

	// Wait for sparse queue to become idle
	deviceInterface.queueWaitIdle(sparseQueue.queueHandle);

	for (deUint32 mipmapNdx = 0; mipmapNdx < imageSparseInfo.mipLevels; ++mipmapNdx)
	{
		const deUint32 mipLevelSizeInBytes	= getImageMipLevelSizeInBytes(imageSparseInfo.extent, imageSparseInfo.arrayLayers, m_format, mipmapNdx);
		const deUint32 bufferOffset			= static_cast<deUint32>(bufferImageCopy[mipmapNdx].bufferOffset);

		if (deMemCmp(outputData + bufferOffset, &referenceData[bufferOffset], mipLevelSizeInBytes) != 0)
			return tcu::TestStatus::fail("Failed");
	}

	return tcu::TestStatus::pass("Passed");
}